

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
peg::SemanticValues::transform<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,SemanticValues *this,size_t beg,size_t end)

{
  unsigned_long *puVar1;
  const_reference __any;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong local_40;
  size_t i;
  undefined1 local_29;
  size_t local_28;
  size_t end_local;
  size_t beg_local;
  SemanticValues *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  
  local_29 = 0;
  local_28 = end;
  end_local = beg;
  beg_local = (size_t)this;
  this_local = (SemanticValues *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  i = std::vector<std::any,_std::allocator<std::any>_>::size
                (&this->super_vector<std::any,_std::allocator<std::any>_>);
  puVar1 = std::min<unsigned_long>(&local_28,&i);
  local_28 = *puVar1;
  for (local_40 = end_local; local_40 < local_28; local_40 = local_40 + 1) {
    __any = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                      (&this->super_vector<std::any,_std::allocator<std::any>_>,local_40);
    std::any_cast<std::__cxx11::string>(&local_60,__any);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> transform(size_t beg = 0,
                           size_t end = static_cast<size_t>(-1)) const {
    std::vector<T> r;
    end = (std::min)(end, size());
    for (size_t i = beg; i < end; i++) {
      r.emplace_back(std::any_cast<T>((*this)[i]));
    }
    return r;
  }